

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

string * __thiscall
absl::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          )

{
  pointer __dest;
  size_t sVar1;
  size_t __n;
  pointer pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)(a->piece_)._M_len + (char)*(undefined8 *)this + (char)(b->piece_)._M_len +
             (char)(c->piece_)._M_len);
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar1 = *(size_t *)this;
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)(this + 8),sVar1);
  }
  pcVar2 = __dest + sVar1;
  sVar1 = (a->piece_)._M_len;
  if (sVar1 != 0) {
    memcpy(pcVar2,(a->piece_)._M_str,sVar1);
  }
  pcVar2 = pcVar2 + sVar1;
  sVar1 = (b->piece_)._M_len;
  if (sVar1 != 0) {
    memcpy(pcVar2,(b->piece_)._M_str,sVar1);
  }
  __n = (c->piece_)._M_len;
  if (__n != 0) {
    memcpy(pcVar2 + sVar1,(c->piece_)._M_str,__n);
  }
  if (pcVar2 + sVar1 + __n == __dest + __return_storage_ptr__->_M_string_length) {
    return __return_storage_ptr__;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0x78,
                "std::string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c,
                   const AlphaNum& d) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size = static_cast<uint64_t>(a.size()) +
                               static_cast<uint64_t>(b.size()) +
                               static_cast<uint64_t>(c.size()) +
                               static_cast<uint64_t>(d.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + result.size());
  return result;
}